

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBaseExc.cpp
# Opt level: O2

void anon_unknown.dwarf_3d15::test7(void)

{
  allocator<char> local_31;
  string local_30 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_30,"err",&local_31);
  Iex_3_4::throwErrnoExc(local_30,1);
  std::__cxx11::string::~string(local_30);
  __assert_fail("caught",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/IexTest/testBaseExc.cpp"
                ,0x11b,"void (anonymous namespace)::testThrowErrnoExc(int) [T = Iex_3_4::EpermExc]")
  ;
}

Assistant:

void
testThrowErrnoExc (int err)
{
    bool caught = false;

    try
    {
        IEX_INTERNAL_NAMESPACE::throwErrnoExc ("err", err);
    }
    catch (const T& e)
    {
        caught = true;
    }
    catch (const std::exception& e)
    {
        std::cerr << "testThrowErrnoExc: caught " << typeid (e).name ()
                  << ", expected " << typeid (T).name () << std::endl;
    }

    assert (caught);
}